

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shake256_impl.c
# Opt level: O1

int shake256_squeeze(keccak_sponge *sponge,uint8_t *out,size_t outlen)

{
  byte *pbVar1;
  int iVar2;
  void *__src;
  ulong __n;
  size_t sVar3;
  uint8_t *state;
  
  iVar2 = -1;
  if (out != (uint8_t *)0x0 && sponge != (keccak_sponge *)0x0) {
    if ((long)outlen < 0) {
      iVar2 = -2;
    }
    else {
      iVar2 = 1;
      if (sponge->position < 0x88) {
        if (sponge->flags != 0x44a50aed67ba8c04) {
          if (sponge->flags != 0x53efb6b64647b401) {
            return 2;
          }
          pbVar1 = (byte *)((long)sponge->a + sponge->position);
          *pbVar1 = *pbVar1 ^ 0x1f;
          pbVar1 = (byte *)((long)sponge->a + 0x87);
          *pbVar1 = *pbVar1 ^ 0x80;
          keccakf(sponge);
          sponge->position = 0;
          sponge->flags = 0x44a50aed67ba8c04;
        }
        if (outlen != 0) {
          do {
            __n = 0x88 - sponge->position;
            __src = (void *)((long)sponge->a + sponge->position);
            sVar3 = outlen - __n;
            if (outlen < __n) {
              memcpy(out,__src,outlen);
              sponge->position = sponge->position + outlen;
              sVar3 = 0;
            }
            else {
              memcpy(out,__src,__n);
              keccakf(sponge);
              sponge->position = 0;
              out = out + __n;
            }
            outlen = sVar3;
          } while (sVar3 != 0);
        }
        iVar2 = 0;
      }
    }
  }
  return iVar2;
}

Assistant:

int shake256_squeeze(keccak_sponge* const __restrict sponge,
                     uint8_t* const __restrict out,
                     const size_t outlen) {
  if (sponge == NULL) {
    return SPONGERR_NULL;
  }
  if (out == NULL) {
    return SPONGERR_NULL;
  }
  if (outlen > (SIZE_MAX >> 1)) {
    return SPONGERR_RSIZE;
  }
  if (sponge->position >= sponge_rate) {
    return SPONGERR_INVARIANT;
  }

  switch (sponge->flags) {
    case (FLAG_SQUEEZING):
      break;
    case (FLAG_ABSORBING):
      // If we're still absorbing, pad the message and apply Keccak-f.
      _shake_pad(sponge);
      sponge->flags = FLAG_SQUEEZING;
      break;
    default:
      // The sponge hasn't been initialized.
      return SPONGERR_NOTINIT;
  }

  _sponge_squeeze(sponge, out, outlen);

  return 0;
}